

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatUtils.h
# Opt level: O1

string * prettySize_abi_cxx11_(string *__return_storage_ptr__,unsigned_long_long bytes)

{
  ostream *poVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ostringstream oss;
  char local_1a9;
  double local_1a8;
  double dStack_1a0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  auVar3._8_4_ = (int)(bytes >> 0x20);
  auVar3._0_8_ = bytes;
  auVar3._12_4_ = 0x45300000;
  dStack_1a0 = auVar3._8_8_ - 1.9342813113834067e+25;
  local_1a8 = dStack_1a0 + ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0);
  lVar2 = 0;
  if (0x3ff < bytes) {
    do {
      local_1a8 = local_1a8 * 0.0009765625;
      lVar2 = lVar2 + 1;
    } while (1024.0 <= local_1a8);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::ostream::_M_insert<double>(local_1a8);
  local_1a9 = "BKMGTP"[lVar2];
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a9,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static inline string prettySize(unsigned long long bytes)
{
    double size = bytes;
    int n = 0;

    while (size >= 1024) {
        size /= 1024;
        n++;
    }

  ostringstream oss;
  oss << size << units[n];

  return oss.str();
}